

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O3

VertexHandle __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::add_vertex
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this)

{
  pointer *ppVVar1;
  ArrayKernel *this_00;
  iterator __position;
  pointer ppBVar2;
  BaseProperty *pBVar3;
  int iVar4;
  BaseHandle BVar5;
  undefined4 extraout_var;
  pointer ppBVar6;
  Vertex local_2c;
  
  this_00 = (ArrayKernel *)this->mesh_;
  local_2c.halfedge_handle_.super_BaseHandle.idx_ = (HalfedgeHandle)(BaseHandle)0xffffffff;
  __position._M_current =
       (this_00->vertices_).
       super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this_00->vertices_).
      super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>::
    _M_realloc_insert<OpenMesh::ArrayItems::Vertex>(&this_00->vertices_,__position,&local_2c);
  }
  else {
    ((__position._M_current)->halfedge_handle_).super_BaseHandle.idx_ = -1;
    ppVVar1 = &(this_00->vertices_).
               super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  iVar4 = (*(this_00->super_BaseKernel)._vptr_BaseKernel[2])(this_00);
  ppBVar2 = (this_00->super_BaseKernel).vprops_.properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar6 = (this_00->super_BaseKernel).vprops_.properties_.
                 super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar6 != ppBVar2;
      ppBVar6 = ppBVar6 + 1) {
    pBVar3 = *ppBVar6;
    if (pBVar3 != (BaseProperty *)0x0) {
      (*pBVar3->_vptr_BaseProperty[3])(pBVar3,CONCAT44(extraout_var,iVar4));
    }
  }
  BVar5.idx_ = (int)ArrayKernel::handle(this_00,(this_00->vertices_).
                                                super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>
                                                ._M_impl.super__Vector_impl_data._M_finish + -1);
  return (BaseHandle)(BaseHandle)BVar5.idx_;
}

Assistant:

virtual VertexHandle add_vertex()
  {
    return mesh_.new_vertex();
  }